

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::FormatCountableNoun_abi_cxx11_
          (string *__return_storage_ptr__,testing *this,int count,char *singular_form,
          char *plural_form)

{
  undefined4 in_register_00000014;
  long in_FS_OFFSET;
  char *local_a0;
  char *plural_form_local;
  char *singular_form_local;
  int local_54;
  undefined1 local_50 [4];
  int count_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_54 = (int)this;
  internal::StreamableToString<int>((string *)local_50,&local_54);
  std::operator+(&local_30,(string *)local_50," ");
  local_a0 = singular_form;
  if (local_54 == 1) {
    local_a0 = (char *)CONCAT44(in_register_00000014,count);
  }
  std::operator+(__return_storage_ptr__,&local_30,local_a0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string FormatCountableNoun(int count,
                                       const char * singular_form,
                                       const char * plural_form) {
  return internal::StreamableToString(count) + " " +
      (count == 1 ? singular_form : plural_form);
}